

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O3

node_le_t * __thiscall
tchecker::tck_reach::concur19::node_le_t::operator=(node_le_t *this,node_le_t *node_le)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  map_t *pmVar3;
  
  if (this != node_le) {
    peVar1 = (node_le->_clockbounds).
             super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (node_le->_clockbounds).
             super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (node_le->_clockbounds).
    super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (node_le->_clockbounds).
    super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->_clockbounds).
              super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->_clockbounds).
    super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->_clockbounds).
    super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pmVar3 = node_le->_u;
    this->_l = node_le->_l;
    this->_u = pmVar3;
    node_le->_l = (map_t *)0x0;
    node_le->_u = (map_t *)0x0;
  }
  return this;
}

Assistant:

tchecker::tck_reach::concur19::node_le_t & node_le_t::operator=(tchecker::tck_reach::concur19::node_le_t && node_le)
{
  if (this != &node_le) {
    _clockbounds = std::move(node_le._clockbounds);
    _l = node_le._l;
    node_le._l = nullptr;
    _u = node_le._u;
    node_le._u = nullptr;
  }
  return *this;
}